

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Obj_t * Gia_ManEquivRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int fUseAll,int fDualOut)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Rpr_t *pGVar3;
  
  pGVar1 = p->pObjs;
  if (fUseAll == 0) {
    if ((pObj < pGVar1) || (iVar2 = p->nObjs, pGVar1 + iVar2 <= pObj)) goto LAB_001fd4c5;
    pGVar3 = p->pReprs;
    if ((pGVar3[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555].field_0x3 & 0x10) == 0
       ) {
      return (Gia_Obj_t *)0x0;
    }
  }
  else {
    if ((pObj < pGVar1) || (iVar2 = p->nObjs, pGVar1 + iVar2 <= pObj)) goto LAB_001fd4c5;
    pGVar3 = p->pReprs;
    if ((~(uint)pGVar3[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] & 0xfffffff) ==
        0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  if (fDualOut != 0) {
    if ((pObj < pGVar1) || (pGVar1 + iVar2 <= pObj)) goto LAB_001fd4c5;
    if (((uint)pGVar3[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] ^
        (uint)pGVar3[(uint)pGVar3[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] &
                     0xfffffff]) < 0x40000000) {
      return (Gia_Obj_t *)0x0;
    }
  }
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + iVar2)) {
    if (iVar2 <= (int)((uint)pGVar3[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] &
                      0xfffffff)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    return pGVar1 + ((uint)pGVar3[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] &
                    0xfffffff);
  }
LAB_001fd4c5:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline Gia_Obj_t * Gia_ManEquivRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int fUseAll, int fDualOut )
{
    if ( fUseAll )
    {
        if ( Gia_ObjRepr(p, Gia_ObjId(p,pObj)) == GIA_VOID )
            return NULL;
    }
    else
    {
        if ( !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
            return NULL;
    }
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
        return NULL;
    return Gia_ManObj( p, Gia_ObjRepr(p, Gia_ObjId(p,pObj)) );
}